

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStep_ComputeInnerForcing(ARKodeMRIStepMem step_mem,int stage,realtype cdiff)

{
  int iVar1;
  int iVar2;
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  N_Vector *Xvecs;
  realtype *cvals;
  int retval;
  int nstore;
  int nmat;
  int k;
  int j;
  realtype rcdiff;
  N_Vector in_stack_ffffffffffffffa8;
  N_Vector *X;
  realtype *c;
  int in_stack_ffffffffffffffc4;
  int local_38;
  int local_30;
  int local_2c;
  
  c = *(realtype **)(in_RDI + 0x198);
  X = *(N_Vector **)(in_RDI + 0x1a0);
  local_38 = 0;
  for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
    if ((*(int *)(in_RDI + 0x18) != 0) &&
       (-1 < *(int *)(*(long *)(in_RDI + 0x50) + (long)local_2c * 4))) {
      X[local_38] = *(N_Vector *)
                     (*(long *)(in_RDI + 0x28) +
                     (long)*(int *)(*(long *)(in_RDI + 0x50) + (long)local_2c * 4) * 8);
      local_38 = local_38 + 1;
    }
    if ((*(int *)(in_RDI + 0x1c) != 0) &&
       (-1 < *(int *)(*(long *)(in_RDI + 0x50) + (long)local_2c * 4))) {
      X[local_38] = *(N_Vector *)
                     (*(long *)(in_RDI + 0x30) +
                     (long)*(int *)(*(long *)(in_RDI + 0x50) + (long)local_2c * 4) * 8);
      local_38 = local_38 + 1;
    }
  }
  iVar1 = **(int **)(in_RDI + 0x38);
  dVar3 = 1.0 / in_XMM0_Qa;
  local_30 = 0;
  while( true ) {
    if (iVar1 <= local_30) {
      return 0;
    }
    local_38 = 0;
    for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
      if (-1 < *(int *)(*(long *)(in_RDI + 0x50) + (long)local_2c * 4)) {
        if ((*(int *)(in_RDI + 0x18) == 0) || (*(int *)(in_RDI + 0x1c) == 0)) {
          if (*(int *)(in_RDI + 0x18) == 0) {
            c[local_38] = dVar3 * *(double *)
                                   (*(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x38) + 0x20) +
                                                       (long)local_30 * 8) + (long)in_ESI * 8) +
                                   (long)local_2c * 8);
          }
          else {
            c[local_38] = dVar3 * *(double *)
                                   (*(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x38) + 0x18) +
                                                       (long)local_30 * 8) + (long)in_ESI * 8) +
                                   (long)local_2c * 8);
          }
          local_38 = local_38 + 1;
        }
        else {
          c[local_38] = dVar3 * *(double *)
                                 (*(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x38) + 0x18) +
                                                     (long)local_30 * 8) + (long)in_ESI * 8) +
                                 (long)local_2c * 8);
          c[local_38 + 1] =
               dVar3 * *(double *)
                        (*(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x38) + 0x20) +
                                            (long)local_30 * 8) + (long)in_ESI * 8) +
                        (long)local_2c * 8);
          local_38 = local_38 + 2;
        }
      }
    }
    iVar2 = N_VLinearCombination(in_stack_ffffffffffffffc4,c,X,in_stack_ffffffffffffffa8);
    if (iVar2 != 0) break;
    local_30 = local_30 + 1;
    in_stack_ffffffffffffffc4 = 0;
  }
  return -0x1c;
}

Assistant:

int mriStep_ComputeInnerForcing(ARKodeMRIStepMem step_mem,
                                int stage, realtype cdiff)
{
  realtype  rcdiff;
  int       j, k, nmat, nstore, retval;
  realtype* cvals;
  N_Vector* Xvecs;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* compute inner forcing vectors (assumes cdiff != 0) */
  nstore = 0;
  for (j = 0; j < stage; j++) {
    if (step_mem->explicit_rhs && step_mem->stage_map[j] > -1) {
      Xvecs[nstore] = step_mem->Fse[step_mem->stage_map[j]];
      nstore += 1;
    }
    if (step_mem->implicit_rhs && step_mem->stage_map[j] > -1) {
      Xvecs[nstore] = step_mem->Fsi[step_mem->stage_map[j]];
      nstore += 1;
    }
  }

  nmat   = step_mem->MRIC->nmat;
  rcdiff = ONE / cdiff;

  for (k = 0; k < nmat; k++) {
    nstore = 0;
    for (j = 0; j < stage; j++) {
      if (step_mem->stage_map[j] > -1) {
        if (step_mem->explicit_rhs && step_mem->implicit_rhs) {
          /* ImEx */
          cvals[nstore] = rcdiff * step_mem->MRIC->W[k][stage][j];
          nstore += 1;
          cvals[nstore] = rcdiff * step_mem->MRIC->G[k][stage][j];
          nstore += 1;
        } else if (step_mem->explicit_rhs) {
          /* explicit only */
          cvals[nstore] = rcdiff * step_mem->MRIC->W[k][stage][j];
          nstore += 1;
        } else {
          /* implicit only */
          cvals[nstore] = rcdiff * step_mem->MRIC->G[k][stage][j];
          nstore += 1;
        }
      }
    }

    retval = N_VLinearCombination(nstore, cvals, Xvecs,
                                  step_mem->stepper->forcing[k]);
    if (retval != 0) return(ARK_VECTOROP_ERR);
  }

#ifdef SUNDIALS_DEBUG_PRINTVEC
  for (k = 0; k < nmat; k++) {
    printf("    MRIStep forcing[%i]:\n", k);
    N_VPrint(step_mem->stepper->forcing[k]);
  }
#endif

  return(ARK_SUCCESS);
}